

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O2

bool __thiscall
brotli::BrotliCompressor::WriteMetadata
          (BrotliCompressor *this,size_t input_size,uint8_t *input_buffer,bool is_last,
          size_t *encoded_size,uint8_t *encoded_buffer)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint64_t hdr_buffer_data [2];
  ulong local_38;
  
  if (0x1000000 < input_size) {
    return false;
  }
  uVar5 = 0;
  if (*encoded_size < input_size + 6) {
    return false;
  }
  bVar1 = this->last_byte_bits_;
  hdr_buffer_data[0]._0_1_ = this->last_byte_;
  *(ulong *)((long)hdr_buffer_data + (ulong)(bVar1 >> 3)) =
       (ulong)*(byte *)((long)hdr_buffer_data + (ulong)(bVar1 >> 3));
  uVar6 = (ulong)bVar1 + 1;
  uVar3 = uVar6 >> 3;
  *(ulong *)((long)hdr_buffer_data + uVar3) =
       3L << ((byte)uVar6 & 7) | (ulong)*(byte *)((long)hdr_buffer_data + uVar3);
  uVar6 = (ulong)(bVar1 + 3 >> 3);
  *(ulong *)((long)hdr_buffer_data + uVar6) = (ulong)*(byte *)((long)hdr_buffer_data + uVar6);
  local_38 = (ulong)bVar1 + 4;
  if (input_size != 1) {
    if (input_size == 0) {
      uVar6 = local_38 >> 3;
      *(ulong *)((long)hdr_buffer_data + uVar6) = (ulong)*(byte *)((long)hdr_buffer_data + uVar6);
      uVar6 = (ulong)(bVar1 + 0xd >> 3);
      *encoded_size = uVar6;
      memcpy(encoded_buffer,hdr_buffer_data,uVar6);
      goto LAB_0017abac;
    }
    uVar4 = (int)input_size - 1;
    uVar5 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = (uVar5 ^ 0xffffffe0) + 0x28 >> 3;
  }
  WriteBits(2,(ulong)uVar5,&local_38,(uint8_t *)hdr_buffer_data);
  WriteBits((ulong)(uVar5 << 3),input_size - 1,&local_38,(uint8_t *)hdr_buffer_data);
  uVar6 = local_38 + 7 >> 3;
  memcpy(encoded_buffer,hdr_buffer_data,uVar6);
  memcpy(encoded_buffer + uVar6,input_buffer,input_size);
  *encoded_size = uVar6 + input_size;
LAB_0017abac:
  if (is_last) {
    sVar2 = *encoded_size;
    *encoded_size = sVar2 + 1;
    encoded_buffer[sVar2] = '\x03';
  }
  this->last_byte_ = '\0';
  this->last_byte_bits_ = '\0';
  return true;
}

Assistant:

bool BrotliCompressor::WriteMetadata(const size_t input_size,
                                     const uint8_t* input_buffer,
                                     const bool is_last,
                                     size_t* encoded_size,
                                     uint8_t* encoded_buffer) {
  if (input_size > (1 << 24) || input_size + 6 > *encoded_size) {
    return false;
  }
  uint64_t hdr_buffer_data[2];
  uint8_t* hdr_buffer = reinterpret_cast<uint8_t*>(&hdr_buffer_data[0]);
  size_t storage_ix = last_byte_bits_;
  hdr_buffer[0] = last_byte_;
  WriteBits(1, 0, &storage_ix, hdr_buffer);
  WriteBits(2, 3, &storage_ix, hdr_buffer);
  WriteBits(1, 0, &storage_ix, hdr_buffer);
  if (input_size == 0) {
    WriteBits(2, 0, &storage_ix, hdr_buffer);
    *encoded_size = (storage_ix + 7u) >> 3;
    memcpy(encoded_buffer, hdr_buffer, *encoded_size);
  } else {
    uint32_t nbits = (input_size == 1) ? 0 : (Log2FloorNonZero(
        static_cast<uint32_t>(input_size) - 1) + 1);
    uint32_t nbytes = (nbits + 7) / 8;
    WriteBits(2, nbytes, &storage_ix, hdr_buffer);
    WriteBits(8 * nbytes, input_size - 1, &storage_ix, hdr_buffer);
    size_t hdr_size = (storage_ix + 7u) >> 3;
    memcpy(encoded_buffer, hdr_buffer, hdr_size);
    memcpy(&encoded_buffer[hdr_size], input_buffer, input_size);
    *encoded_size = hdr_size + input_size;
  }
  if (is_last) {
    encoded_buffer[(*encoded_size)++] = 3;
  }
  last_byte_ = 0;
  last_byte_bits_ = 0;
  return true;
}